

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O2

void SoPlex_addRowReal(void *soplex,double *rowentries,int rowsize,int nnonzeros,double lb,double ub
                      )

{
  ulong uVar1;
  ulong uVar2;
  DSVector row;
  DSVectorBase<double> local_80;
  LPRowBase<double> local_60;
  
  ::soplex::DSVectorBase<double>::DSVectorBase(&local_80,nnonzeros);
  uVar1 = 0;
  uVar2 = (ulong)(uint)rowsize;
  if (rowsize < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    if ((*rowentries != 0.0) || (NAN(*rowentries))) {
      ::soplex::DSVectorBase<double>::add(&local_80,(int)uVar1,rowentries);
    }
    rowentries = rowentries + 1;
  }
  local_60.object = 0.0;
  local_60.left = lb;
  local_60.right = ub;
  ::soplex::DSVectorBase<double>::DSVectorBase<double>
            (&local_60.vec,&local_80.super_SVectorBase<double>);
  ::soplex::SoPlexBase<double>::addRowReal((SoPlexBase<double> *)soplex,&local_60);
  ::soplex::DSVectorBase<double>::~DSVectorBase(&local_60.vec);
  ::soplex::DSVectorBase<double>::~DSVectorBase(&local_80);
  return;
}

Assistant:

void SoPlex_addRowReal(void* soplex, double* rowentries, int rowsize, int nnonzeros, double lb,
                       double ub)
{
   SoPlex* so = (SoPlex*)(soplex);
   DSVector row(nnonzeros);

   /* add nonzero entries to row vector */
   for(int i = 0; i < rowsize; ++i)
   {
      if(rowentries[i] != 0.0)
         row.add(i, rowentries[i]);
   }

   so->addRowReal(LPRow(lb, row, ub));
}